

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void bk_lib::detail::fill<Clasp::Asp::PrgBody*>(PrgBody **first,PrgBody **last,PrgBody **x)

{
  PrgBody *pPVar1;
  
  switch((uint)((int)last - (int)first) >> 3 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      pPVar1 = *x;
      *first = pPVar1;
      first = first + 1;
LAB_0014288d:
      *first = pPVar1;
      first = first + 1;
switchD_00142868_caseD_6:
      pPVar1 = *x;
      *first = pPVar1;
      first = first + 1;
LAB_0014289e:
      *first = pPVar1;
      first = first + 1;
switchD_00142868_caseD_4:
      pPVar1 = *x;
      *first = pPVar1;
      first = first + 1;
LAB_001428af:
      *first = pPVar1;
      first = first + 1;
switchD_00142868_caseD_2:
      pPVar1 = *x;
      *first = pPVar1;
      first = first + 1;
LAB_001428c0:
      *first = pPVar1;
    }
    break;
  case 1:
    pPVar1 = *x;
    goto LAB_001428c0;
  case 2:
    goto switchD_00142868_caseD_2;
  case 3:
    pPVar1 = *x;
    goto LAB_001428af;
  case 4:
    goto switchD_00142868_caseD_4;
  case 5:
    pPVar1 = *x;
    goto LAB_0014289e;
  case 6:
    goto switchD_00142868_caseD_6;
  case 7:
    pPVar1 = *x;
    goto LAB_0014288d;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}